

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

void remove_dot_segments(char *inout)

{
  int iVar1;
  char *pcVar2;
  char *out_end;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  size_t __n;
  
  pcVar4 = inout;
  if (inout == (char *)0x0) {
    return;
  }
  do {
    if (*pcVar4 == '\\') {
      *pcVar4 = '/';
    }
    else {
      pcVar2 = inout;
      pcVar5 = inout;
      if (*pcVar4 == '\0') break;
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
LAB_0011e341:
  cVar3 = *pcVar5;
  if (cVar3 == '\0') {
    *pcVar2 = '\0';
    pcVar4 = inout;
    pcVar2 = inout;
    while( true ) {
      while (pcVar5 = pcVar2, cVar3 = *pcVar4, cVar3 == '.') {
        __n = 0;
        do {
          cVar3 = pcVar4[__n + 1];
          __n = __n + 1;
        } while (cVar3 == '.');
        if (cVar3 == '\0') {
          pcVar4 = pcVar4 + __n;
          pcVar2 = pcVar5;
        }
        else if (cVar3 == '/') {
          pcVar4 = pcVar4 + __n;
          pcVar2 = inout;
          if ((pcVar5 != inout) && (pcVar2 = pcVar5 + -1, pcVar5[-1] != '/')) {
            pcVar2 = pcVar5;
          }
        }
        else {
          memset(pcVar5,0x2e,__n);
          pcVar4 = pcVar4 + __n;
          pcVar2 = pcVar5 + __n;
        }
      }
      if (cVar3 == '\0') break;
      if (cVar3 == '/') {
        *pcVar5 = '/';
        do {
          pcVar2 = pcVar4 + 1;
          pcVar4 = pcVar4 + 1;
        } while (*pcVar2 == '/');
        pcVar2 = pcVar5 + 1;
      }
      else {
        *pcVar5 = cVar3;
        pcVar4 = pcVar4 + 1;
        pcVar2 = pcVar5 + 1;
      }
    }
    *pcVar5 = '\0';
    return;
  }
  if (cVar3 == '.') {
    if ((pcVar5[1] == '.') && (pcVar5[2] == '/')) {
      pcVar5 = pcVar5 + 3;
      goto LAB_0011e341;
    }
    if (pcVar5[1] != '/') {
LAB_0011e39e:
      iVar1 = strncmp(pcVar5,"/../",4);
      if (iVar1 == 0) {
        pcVar5 = pcVar5 + 3;
        if (pcVar2 == inout) goto LAB_0011e341;
        pcVar4 = pcVar2 + -1;
        do {
          pcVar2 = inout;
          if (pcVar4 == inout) goto LAB_0011e341;
          pcVar2 = pcVar4 + -1;
          cVar3 = *pcVar4;
          pcVar4 = pcVar2;
        } while (cVar3 != '/');
      }
      else {
        iVar1 = strcmp(pcVar5,"/..");
        if (iVar1 != 0) {
          if ((cVar3 == '.') && ((pcVar5[1] == '\0' || ((pcVar5[1] == '.' && (pcVar5[2] == '\0')))))
             ) {
            *pcVar5 = '\0';
          }
          else {
            do {
              *pcVar2 = cVar3;
              pcVar2 = pcVar2 + 1;
              cVar3 = pcVar5[1];
              pcVar5 = pcVar5 + 1;
              if (cVar3 == '\0') break;
            } while (cVar3 != '/');
          }
          goto LAB_0011e341;
        }
        pcVar5[1] = '\0';
        if (pcVar2 == inout) goto LAB_0011e341;
        pcVar4 = pcVar2 + -1;
        do {
          pcVar2 = inout;
          if (pcVar4 == inout) goto LAB_0011e341;
          pcVar2 = pcVar4 + -1;
          cVar3 = *pcVar4;
          pcVar4 = pcVar2;
        } while (cVar3 != '/');
      }
      pcVar2 = pcVar2 + 1;
      goto LAB_0011e341;
    }
LAB_0011e398:
    pcVar5 = pcVar5 + 2;
    goto LAB_0011e341;
  }
  if (cVar3 != '/') goto LAB_0011e39e;
  if ((pcVar5[1] == '.') && (pcVar5[2] == '/')) goto LAB_0011e398;
  if ((pcVar5[1] != '.') || (pcVar5[2] != '\0')) goto LAB_0011e39e;
  pcVar5[1] = '\0';
  goto LAB_0011e341;
}

Assistant:

static void
remove_dot_segments(char *inout)
{
	/* Windows backend protection
	 * (https://tools.ietf.org/html/rfc3986#section-7.3): Replace backslash
	 * in URI by slash */
	char *out_end = inout;
	char *in = inout;

	if (!in) {
		/* Param error. */
		return;
	}

	while (*in) {
		if (*in == '\\') {
			*in = '/';
		}
		in++;
	}

	/* Algorithm "remove_dot_segments" from
	 * https://tools.ietf.org/html/rfc3986#section-5.2.4 */
	/* Step 1:
	 * The input buffer is initialized.
	 * The output buffer is initialized to the empty string.
	 */
	in = inout;

	/* Step 2:
	 * While the input buffer is not empty, loop as follows:
	 */
	/* Less than out_end of the inout buffer is used as output, so keep
	 * condition: out_end <= in */
	while (*in) {
		/* Step 2a:
		 * If the input buffer begins with a prefix of "../" or "./",
		 * then remove that prefix from the input buffer;
		 */
		if (!strncmp(in, "../", 3)) {
			in += 3;
		} else if (!strncmp(in, "./", 2)) {
			in += 2;
		}
		/* otherwise */
		/* Step 2b:
		 * if the input buffer begins with a prefix of "/./" or "/.",
		 * where "." is a complete path segment, then replace that
		 * prefix with "/" in the input buffer;
		 */
		else if (!strncmp(in, "/./", 3)) {
			in += 2;
		} else if (!strcmp(in, "/.")) {
			in[1] = 0;
		}
		/* otherwise */
		/* Step 2c:
		 * if the input buffer begins with a prefix of "/../" or "/..",
		 * where ".." is a complete path segment, then replace that
		 * prefix with "/" in the input buffer and remove the last
		 * segment and its preceding "/" (if any) from the output
		 * buffer;
		 */
		else if (!strncmp(in, "/../", 4)) {
			in += 3;
			if (inout != out_end) {
				/* remove last segment */
				do {
					out_end--;
				} while ((inout != out_end) && (*out_end != '/'));
			}
		} else if (!strcmp(in, "/..")) {
			in[1] = 0;
			if (inout != out_end) {
				/* remove last segment */
				do {
					out_end--;
				} while ((inout != out_end) && (*out_end != '/'));
			}
		}
		/* otherwise */
		/* Step 2d:
		 * if the input buffer consists only of "." or "..", then remove
		 * that from the input buffer;
		 */
		else if (!strcmp(in, ".") || !strcmp(in, "..")) {
			*in = 0;
		}
		/* otherwise */
		/* Step 2e:
		 * move the first path segment in the input buffer to the end of
		 * the output buffer, including the initial "/" character (if
		 * any) and any subsequent characters up to, but not including,
		 * the next "/" character or the end of the input buffer.
		 */
		else {
			do {
				*out_end = *in;
				out_end++;
				in++;
			} while ((*in != 0) && (*in != '/'));
		}
	}

	/* Step 3:
	 * Finally, the output buffer is returned as the result of
	 * remove_dot_segments.
	 */
	/* Terminate output */
	*out_end = 0;

	/* For Windows, the files/folders "x" and "x." (with a dot but without
	 * extension) are identical. Replace all "./" by "/" and remove a "." at
	 * the end. Also replace all "//" by "/". Repeat until there is no "./"
	 * or "//" anymore.
	 */
	out_end = in = inout;
	while (*in) {
		if (*in == '.') {
			/* remove . at the end or preceding of / */
			char *in_ahead = in;
			do {
				in_ahead++;
			} while (*in_ahead == '.');
			if (*in_ahead == '/') {
				in = in_ahead;
				if ((out_end != inout) && (out_end[-1] == '/')) {
					/* remove generated // */
					out_end--;
				}
			} else if (*in_ahead == 0) {
				in = in_ahead;
			} else {
				do {
					*out_end++ = '.';
					in++;
				} while (in != in_ahead);
			}
		} else if (*in == '/') {
			/* replace // by / */
			*out_end++ = '/';
			do {
				in++;
			} while (*in == '/');
		} else {
			*out_end++ = *in;
			in++;
		}
	}
	*out_end = 0;
}